

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

void FT_Vector_Transform(FT_Vector *vector,FT_Matrix *matrix)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (matrix != (FT_Matrix *)0x0 && vector != (FT_Vector *)0x0) {
    lVar1 = (long)(int)vector->x;
    lVar2 = (int)matrix->xx * lVar1;
    lVar3 = (long)(int)vector->y;
    lVar4 = (int)matrix->xy * lVar3;
    lVar1 = (int)matrix->yx * lVar1;
    lVar3 = (int)matrix->yy * lVar3;
    vector->x = (long)(int)((ulong)(lVar4 + 0x8000 + (lVar4 >> 0x3f)) >> 0x10) +
                (long)(int)((ulong)(lVar2 + 0x8000 + (lVar2 >> 0x3f)) >> 0x10);
    vector->y = (long)(int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10) +
                (long)(int)((ulong)(lVar1 + 0x8000 + (lVar1 >> 0x3f)) >> 0x10);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Transform( FT_Vector*        vector,
                       const FT_Matrix*  matrix )
  {
    FT_Pos  xz, yz;


    if ( !vector || !matrix )
      return;

    xz = FT_MulFix( vector->x, matrix->xx ) +
         FT_MulFix( vector->y, matrix->xy );

    yz = FT_MulFix( vector->x, matrix->yx ) +
         FT_MulFix( vector->y, matrix->yy );

    vector->x = xz;
    vector->y = yz;
  }